

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinFilter
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  uint offset;
  pointer pFVar1;
  pointer pVVar2;
  HeapEntity *context;
  HeapEntity *pHVar3;
  pointer ppHVar4;
  mapped_type pHVar5;
  anon_union_8_3_4e909c26_for_v aVar6;
  undefined4 uVar7;
  mapped_type *ppHVar8;
  RuntimeError *__return_storage_ptr__;
  allocator_type *in_RCX;
  AST *pAVar9;
  Value VVar10;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  BindingFrame bindings;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_50;
  Type local_38 [2];
  
  pFVar1 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"filter","");
  local_38[0] = FUNCTION;
  local_38[1] = ARRAY;
  __l._M_len = 2;
  __l._M_array = local_38;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_50,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)local_88,args,&local_50);
  if (local_50.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78[0]._M_allocated_capacity + 1));
  }
  pVVar2 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  context = (pVVar2->v).h;
  if (*(long *)&context[5].mark - (long)context[5]._vptr_HeapEntity == 0x10) {
    pHVar3 = pVVar2[1].v.h;
    if (*(_func_int ***)&pHVar3[1].mark == pHVar3[1]._vptr_HeapEntity) {
      local_88._0_8_ = (pointer)0x0;
      local_88._8_8_ = (pointer)0x0;
      local_78[0]._M_allocated_capacity = 0;
      VVar10 = makeArray(this,(vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                               *)local_88);
      (this->scratch).t = ARRAY;
      (this->scratch).v = VVar10._0_8_;
      pAVar9 = (AST *)0x0;
    }
    else {
      pFVar1[-1].kind = FRAME_BUILTIN_FILTER;
      uVar7 = *(undefined4 *)&pVVar2->field_0x4;
      aVar6 = pVVar2->v;
      pFVar1[-1].val.t = pVVar2->t;
      *(undefined4 *)&pFVar1[-1].val.field_0x4 = uVar7;
      pFVar1[-1].val.v = aVar6;
      pVVar2 = (args->
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = *(undefined4 *)&pVVar2[1].field_0x4;
      aVar6 = pVVar2[1].v;
      pFVar1[-1].val2.t = pVVar2[1].t;
      *(undefined4 *)&pFVar1[-1].val2.field_0x4 = uVar7;
      pFVar1[-1].val2.v = aVar6;
      ppHVar4 = pFVar1[-1].thunks.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pFVar1[-1].thunks.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppHVar4) {
        pFVar1[-1].thunks.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppHVar4;
      }
      pFVar1[-1].elementId = 0;
      pHVar5 = (mapped_type)*pHVar3[1]._vptr_HeapEntity;
      std::
      map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
      ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             *)local_88,
            (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             *)(context + 1));
      ppHVar8 = std::
                map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                ::operator[]((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                              *)local_88,(key_type *)context[5]._vptr_HeapEntity);
      *ppHVar8 = pHVar5;
      offset._0_1_ = context[4].mark;
      offset._1_1_ = context[4].type;
      offset._2_2_ = *(undefined2 *)&context[4].field_0xa;
      Stack::newCall(&this->stack,loc,context,(HeapObject *)context[4]._vptr_HeapEntity,offset,
                     (BindingFrame *)local_88);
      pAVar9 = *(AST **)&context[6].mark;
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
      ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  *)local_78[0]._0_8_,(_Link_type)loc);
    }
    return pAVar9;
  }
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"filter function takes 1 parameter.","");
  Stack::makeError(__return_storage_ptr__,&this->stack,loc,(string *)local_88);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinFilter(const LocationRange &loc, const std::vector<Value> &args)
    {
        Frame &f = stack.top();
        validateBuiltinArgs(loc, "filter", args, {Value::FUNCTION, Value::ARRAY});
        auto *func = static_cast<HeapClosure *>(args[0].v.h);
        auto *arr = static_cast<HeapArray *>(args[1].v.h);
        if (func->params.size() != 1) {
            throw makeError(loc, "filter function takes 1 parameter.");
        }
        if (arr->elements.size() == 0) {
            scratch = makeArray({});
        } else {
            f.kind = FRAME_BUILTIN_FILTER;
            f.val = args[0];
            f.val2 = args[1];
            f.thunks.clear();
            f.elementId = 0;

            auto *thunk = arr->elements[f.elementId];
            BindingFrame bindings = func->upValues;
            bindings[func->params[0].id] = thunk;
            stack.newCall(loc, func, func->self, func->offset, bindings);
            return func->body;
        }
        return nullptr;
    }